

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall dxil_spv::CFGStructurizer::find_loops(CFGStructurizer *this,uint pass)

{
  CFGNode *pCVar1;
  undefined8 uVar2;
  pointer header;
  bool bVar3;
  reference ppCVar4;
  pointer *this_00;
  pointer *this_01;
  pointer *this_02;
  size_type sVar5;
  CFGNode *pCVar6;
  pointer *pppCVar7;
  reference ppCVar8;
  void *pvVar9;
  bool local_1205;
  bool local_1204;
  bool local_1203;
  bool local_1202;
  bool local_1201;
  bool local_11f2;
  bool local_11f1;
  char local_11e8 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  CFGNode *local_1d8;
  CFGNode *dominated_merge;
  CFGNode *merge;
  LoopMergeAnalysis merge_result;
  CFGNode *ladder;
  CFGNode *merge_block;
  CFGNode *direct_exit_pdom;
  CFGNode *e_4;
  iterator __end3_4;
  iterator __begin3_4;
  Vector<CFGNode_*> *__range3_4;
  CFGNode *e_3;
  iterator __end3_3;
  iterator __begin3_3;
  Vector<CFGNode_*> *__range3_3;
  CFGNode *e_2;
  iterator __end3_2;
  iterator __begin3_2;
  Vector<CFGNode_*> *__range3_2;
  CFGNode *e_1;
  iterator __end3_1;
  iterator __begin3_1;
  Vector<CFGNode_*> *__range3_1;
  CFGNode *e;
  iterator __end3;
  iterator __begin3;
  Vector<CFGNode_*> *__range3;
  CFGNode *innermost_loop_header;
  bool loop_exit_dominates_continue;
  CFGNode *candidate;
  bool trivial_exit_loop;
  bool force_infinite_loop;
  Vector<CFGNode_*> *non_dominated_exit;
  Vector<CFGNode_*> *inner_dominated_exit;
  Vector<CFGNode_*> *dominated_exit;
  LoopAnalysis result;
  CFGNode *node;
  size_type index;
  uint pass_local;
  CFGStructurizer *this_local;
  
  for (node = (CFGNode *)
              std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size(&this->forward_post_visit_order); node != (CFGNode *)0x0;
      node = (CFGNode *)
             ((long)&node[-1].post_dominance_frontier.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
    ppCVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[](&this->forward_post_visit_order,
                           (size_type)
                           ((long)&node[-1].post_dominance_frontier.
                                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    result.dominated_continue_exit.
    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppCVar4;
    if (((((CFGNode *)
          result.dominated_continue_exit.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->freeze_structured_analysis & 1U) == 0
        ) || (((CFGNode *)
              result.dominated_continue_exit.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->merge != Loop)) {
      bVar3 = CFGNode::has_pred_back_edges
                        ((CFGNode *)
                         result.dominated_continue_exit.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar3) {
        *(undefined4 *)
         (result.dominated_continue_exit.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x1b) = 1;
        analyze_loop((LoopAnalysis *)&dominated_exit,this,
                     (CFGNode *)
                     result.dominated_continue_exit.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_00 = &result.inner_direct_exits.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        this_01 = &result.dominated_exit.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        this_02 = &result.inner_dominated_exit.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        bVar3 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       *)&result.non_dominated_exit.
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar3) {
          __assert_fail("result.dominated_continue_exit.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                        ,0x1851,"bool dxil_spv::CFGStructurizer::find_loops(unsigned int)");
        }
        candidate._7_1_ = false;
        sVar5 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)this_00);
        local_11f1 = false;
        if (sVar5 == 1) {
          bVar3 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           *)&result.inner_dominated_exit.
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_11f1 = false;
          if (bVar3) {
            bVar3 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             *)&result.dominated_exit.
                                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_11f1 = false;
            if (bVar3) {
              bVar3 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               *)&dominated_exit);
              local_11f1 = false;
              if (bVar3) {
                local_11f1 = std::
                             vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                      *)&result.direct_exits.
                                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
            }
          }
        }
        candidate._6_1_ = local_11f1;
        if (local_11f1 != false) {
          ppCVar4 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             *)this_00);
          local_11f2 = false;
          if ((*ppCVar4)->immediate_dominator != (CFGNode *)0x0) {
            local_11f2 = CFGNode::dominates((*ppCVar4)->immediate_dominator,
                                            result.dominated_continue_exit.
                                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage[0x31]
                                           );
          }
          header = result.dominated_continue_exit.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ppCVar4 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             *)this_00);
          pCVar6 = get_innermost_loop_header_for(this,(CFGNode *)header,*ppCVar4);
          if (((CFGNode *)
               result.dominated_continue_exit.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != pCVar6) &&
             ((bVar3 = std::
                       vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ::empty(&pCVar6->pred_back_edge->succ), !bVar3 || (local_11f2 == false)))) {
            candidate._6_1_ = false;
          }
        }
        bVar3 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                empty(&result.dominated_continue_exit.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[0x31]->succ);
        if ((bVar3) && (candidate._6_1_ == false)) {
          candidate._7_1_ = true;
          pppCVar7 = &result.inner_direct_exits.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3 = std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)pppCVar7);
          e = (CFGNode *)
              std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)pppCVar7);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                             *)&e), bVar3) {
            ppCVar8 = __gnu_cxx::
                      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                      ::operator*(&__end3);
            local_1201 = false;
            if (candidate._7_1_ != false) {
              local_1201 = loop_exit_supports_infinite_loop
                                     (this,(CFGNode *)
                                           result.dominated_continue_exit.
                                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      *ppCVar8);
            }
            candidate._7_1_ = local_1201;
            __gnu_cxx::
            __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
            ::operator++(&__end3);
          }
          pppCVar7 = &result.inner_dominated_exit.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3_1 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              *)pppCVar7);
          e_1 = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)pppCVar7);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3_1,
                                    (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&e_1), bVar3) {
            ppCVar8 = __gnu_cxx::
                      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                      ::operator*(&__end3_1);
            local_1202 = false;
            if (candidate._7_1_ != false) {
              local_1202 = loop_exit_supports_infinite_loop
                                     (this,(CFGNode *)
                                           result.dominated_continue_exit.
                                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      *ppCVar8);
            }
            candidate._7_1_ = local_1202;
            __gnu_cxx::
            __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
            ::operator++(&__end3_1);
          }
          pppCVar7 = &result.dominated_exit.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3_2 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              *)pppCVar7);
          e_2 = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)pppCVar7);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3_2,
                                    (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&e_2), bVar3) {
            ppCVar8 = __gnu_cxx::
                      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                      ::operator*(&__end3_2);
            local_1203 = false;
            if (candidate._7_1_ != false) {
              local_1203 = loop_exit_supports_infinite_loop
                                     (this,(CFGNode *)
                                           result.dominated_continue_exit.
                                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      *ppCVar8);
            }
            candidate._7_1_ = local_1203;
            __gnu_cxx::
            __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
            ::operator++(&__end3_2);
          }
          __end3_3 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              *)&dominated_exit);
          e_3 = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&dominated_exit);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3_3,
                                    (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&e_3), bVar3) {
            ppCVar8 = __gnu_cxx::
                      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                      ::operator*(&__end3_3);
            local_1204 = false;
            if (candidate._7_1_ != false) {
              local_1204 = loop_exit_supports_infinite_loop
                                     (this,(CFGNode *)
                                           result.dominated_continue_exit.
                                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      *ppCVar8);
            }
            candidate._7_1_ = local_1204;
            __gnu_cxx::
            __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
            ::operator++(&__end3_3);
          }
          pppCVar7 = &result.direct_exits.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end3_4 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::begin((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              *)pppCVar7);
          e_4 = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)pppCVar7);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3_4,
                                    (__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&e_4), bVar3) {
            ppCVar8 = __gnu_cxx::
                      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                      ::operator*(&__end3_4);
            local_1205 = false;
            if (candidate._7_1_ != false) {
              local_1205 = loop_exit_supports_infinite_loop
                                     (this,(CFGNode *)
                                           result.dominated_continue_exit.
                                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      *ppCVar8);
            }
            candidate._7_1_ = local_1205;
            __gnu_cxx::
            __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
            ::operator++(&__end3_4);
          }
        }
        if ((candidate._7_1_ != false) ||
           (((bVar3 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               *)this_00), bVar3 &&
             (bVar3 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               *)this_01), bVar3)) &&
            (bVar3 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              *)this_02), bVar3)))) {
          result.dominated_continue_exit.
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c] = (CFGNode *)0x0;
          goto LAB_0019d829;
        }
        sVar5 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      *)this_00);
        if (((sVar5 == 1) &&
            (bVar3 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              *)this_02), bVar3)) &&
           (bVar3 = std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             *)this_01), bVar3)) {
          merge_block = (CFGNode *)0x0;
          bVar3 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           *)&dominated_exit);
          if (!bVar3) {
            merge_block = find_common_post_dominator((Vector<CFGNode_*> *)&dominated_exit);
          }
          if (merge_block == (CFGNode *)0x0) {
LAB_0019d536:
            ppCVar4 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               *)this_00);
            result.dominated_continue_exit.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c] = *ppCVar4;
          }
          else {
            ppCVar4 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               *)this_00);
            bVar3 = query_reachability(this,*ppCVar4,merge_block);
            if (!bVar3) goto LAB_0019d536;
            ppCVar4 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               *)this_00);
            result.dominated_continue_exit.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1d] = *ppCVar4;
            result.dominated_continue_exit.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c] = merge_block;
          }
          CFGNode::add_unique_header
                    (result.dominated_continue_exit.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c],
                     (CFGNode *)
                     result.dominated_continue_exit.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0019d829:
          bVar3 = false;
        }
        else {
          bVar3 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           *)this_00);
          if (((bVar3) &&
              (bVar3 = std::
                       vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ::empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                *)this_01), bVar3)) &&
             (sVar5 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              *)this_02), sVar5 == 1)) {
            ppCVar4 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                               *)this_02);
            merge_result.infinite_continue_ladder =
                 create_ladder_block(this,(CFGNode *)
                                          result.dominated_continue_exit.
                                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     *ppCVar4,".merge");
            result.dominated_continue_exit.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1d] = (CFGNode *)0x0;
            result.dominated_continue_exit.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c] =
                 merge_result.infinite_continue_ladder;
            CFGNode::add_unique_header
                      (result.dominated_continue_exit.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c],
                       (CFGNode *)
                       result.dominated_continue_exit.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            goto LAB_0019d829;
          }
          analyze_loop_merge((LoopMergeAnalysis *)&merge,this,
                             (CFGNode *)
                             result.dominated_continue_exit.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (LoopAnalysis *)&dominated_exit);
          pCVar1 = merge_result.merge;
          pCVar6 = merge;
          local_1d8 = merge_result.merge;
          if ((pass != 0) ||
             (bVar3 = rewrite_complex_loop_exits
                                (this,(CFGNode *)
                                      result.dominated_continue_exit.
                                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,merge,
                                 (Vector<CFGNode_*> *)this_00), !bVar3)) {
            if (pCVar6 == (CFGNode *)0x0) {
              buffer._4088_8_ = get_thread_log_callback();
              if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
                fprintf(_stderr,"[WARN]: Failed to find a common merge point ...\n");
                fflush(_stderr);
              }
              else {
                snprintf(local_11e8,0x1000,"Failed to find a common merge point ...\n");
                uVar2 = buffer._4088_8_;
                pvVar9 = get_thread_log_callback_userdata();
                (*(code *)uVar2)(pvVar9,1,local_11e8);
              }
            }
            else {
              bVar3 = CFGNode::can_loop_merge_to
                                ((CFGNode *)
                                 result.dominated_continue_exit.
                                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,pCVar6);
              if (bVar3) {
                result.dominated_continue_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c] = pCVar6;
                CFGNode::add_unique_header
                          (result.dominated_continue_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c],
                           (CFGNode *)
                           result.dominated_continue_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                if ((pCVar1 == (CFGNode *)0x0) &&
                   (sVar5 = std::
                            vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ::size(&result.dominated_continue_exit.
                                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage[0x31]->succ),
                   sVar5 == 1)) {
                  pCVar1 = result.dominated_continue_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[0x31];
                  ppCVar4 = std::
                            vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ::front(&result.dominated_continue_exit.
                                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0x31]->succ)
                  ;
                  local_1d8 = create_ladder_block(this,pCVar1,*ppCVar4,".merge");
                }
                result.dominated_continue_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1d] = local_1d8;
                result.dominated_continue_exit.
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c] = pCVar6;
                CFGNode::add_unique_header
                          (result.dominated_continue_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[0x1c],
                           (CFGNode *)
                           result.dominated_continue_exit.
                           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
            }
            goto LAB_0019d829;
          }
          this_local._7_1_ = 1;
          bVar3 = true;
        }
        LoopAnalysis::~LoopAnalysis((LoopAnalysis *)&dominated_exit);
        if (bVar3) goto LAB_0019d864;
      }
    }
    else {
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      push_back(&((CFGNode *)
                 result.dominated_continue_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->loop_merge_block->headers,
                (value_type *)
                &result.dominated_continue_exit.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  this_local._7_1_ = 0;
LAB_0019d864:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CFGStructurizer::find_loops(unsigned pass)
{
	for (auto index = forward_post_visit_order.size(); index; index--)
	{
		// Visit in reverse order so we resolve outer loops first,
		// this lets us detect ladder-breaking loops.
		auto *node = forward_post_visit_order[index - 1];

		if (node->freeze_structured_analysis)
		{
			// If we have a pre-created dummy loop for ladding breaking,
			// just propagate the header information and be done with it.
			if (node->merge == MergeType::Loop)
			{
				node->loop_merge_block->headers.push_back(node);
				continue;
			}
		}

		if (!node->has_pred_back_edges())
			continue;

		// There are back-edges here, this must be a loop header.
		node->merge = MergeType::Loop;

		auto result = analyze_loop(node);
		auto &dominated_exit = result.dominated_exit;
		auto &inner_dominated_exit = result.inner_dominated_exit;
		auto &non_dominated_exit = result.non_dominated_exit;

		// This should not come up here, and must be handled in transpose loops.
		assert(result.dominated_continue_exit.empty());

		// Detect infinite loop with an exit which is only in inner loop construct.
		// It is impossible to construct a merge block in this case since the merge targets,
		// so just merge to unreachable.
		bool force_infinite_loop = false;

		// If we have a trivial case where there is only one possible loop exit which we dominate,
		// we shouldn't consider it an infinite loop, but a merge.
		bool trivial_exit_loop = dominated_exit.size() == 1 && result.non_dominated_exit.empty() &&
		                         result.inner_dominated_exit.empty() && result.direct_exits.empty() &&
		                         result.inner_direct_exits.empty();

		if (trivial_exit_loop)
		{
			auto *candidate = dominated_exit.front();

			// Resolve some false positives. It's possible that a loop exit can be detected as inner,
			// but it's just a good merge candidate for an inner infinite loop.
			bool loop_exit_dominates_continue =
				candidate->immediate_dominator &&
			    candidate->immediate_dominator->dominates(node->pred_back_edge);

			// If we promoted inner header, this is not a trivial exit.
			const CFGNode *innermost_loop_header = get_innermost_loop_header_for(node, dominated_exit.front());
			if (node != innermost_loop_header)
			{
				// There are at least two scenarios where we have to be careful:
				// - If the innermost header has a edge out of continue block.
				//   If we still detect this as belong to inner loop, it must be the case.
				// - Also, only accept this as a trivial exit if the immediate dominator of exit also dominates
				//   continue block.
				if (!innermost_loop_header->pred_back_edge->succ.empty() || !loop_exit_dominates_continue)
					trivial_exit_loop = false;
			}
		}

		if (node->pred_back_edge->succ.empty() && !trivial_exit_loop)
		{
			force_infinite_loop = true;
			for (auto *e : result.dominated_exit)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.non_dominated_exit)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.inner_dominated_exit)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.direct_exits)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
			for (auto *e : result.inner_direct_exits)
				force_infinite_loop = force_infinite_loop && loop_exit_supports_infinite_loop(node, e);
		}

		if (force_infinite_loop ||
		    (dominated_exit.empty() && inner_dominated_exit.empty() && non_dominated_exit.empty()))
		{
			// There can be zero loop exits, i.e. infinite loop. This means we have no merge block.
			// We will invent a merge block to satisfy SPIR-V validator, and declare it as unreachable.
			node->loop_merge_block = nullptr;
			//LOGI("Loop without merge: %p (%s)\n", static_cast<const void *>(node), node->name.c_str());
		}
		else if (dominated_exit.size() == 1 && non_dominated_exit.empty() && inner_dominated_exit.empty())
		{
			CFGNode *direct_exit_pdom = nullptr;
			if (!result.direct_exits.empty())
				direct_exit_pdom = find_common_post_dominator(result.direct_exits);

			if (direct_exit_pdom && query_reachability(*dominated_exit.front(), *direct_exit_pdom))
			{
				node->loop_ladder_block = dominated_exit.front();
				node->loop_merge_block = direct_exit_pdom;
			}
			else
			{
				// Clean merge.
				// This is a unique merge block. There can be no other merge candidate.
				node->loop_merge_block = dominated_exit.front();
			}

			const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			//LOGI("Loop with simple merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node), node->name.c_str(),
			//     static_cast<const void *>(node->loop_merge_block), node->loop_merge_block->name.c_str());
		}
		else if (dominated_exit.empty() && inner_dominated_exit.empty() && non_dominated_exit.size() == 1)
		{
			// Single-escape merge.
			// It is unique, but we need workarounds later.
			auto *merge_block = non_dominated_exit.front();

			// We can make the non-dominated exit dominated by
			// adding a ladder block in-between. This allows us to merge the loop cleanly
			// before breaking out.
			auto *ladder = create_ladder_block(node, merge_block, ".merge");
			node->loop_ladder_block = nullptr;
			node->loop_merge_block = ladder;

			const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			//LOGI("Loop with ladder merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node), node->name.c_str(),
			//     static_cast<const void *>(node->loop_merge_block), node->loop_merge_block->name.c_str());
		}
		else
		{
			auto merge_result = analyze_loop_merge(node, result);
			auto *merge = merge_result.merge;
			auto *dominated_merge = merge_result.dominated_merge;

			if (pass == 0 && rewrite_complex_loop_exits(node, merge, dominated_exit))
				return true;

			if (!merge)
			{
				LOGW("Failed to find a common merge point ...\n");
			}
			else if (node->can_loop_merge_to(merge))
			{
				// Clean merge.
				// This is a unique merge block. There can be no other merge candidate.
				//LOGI("Loop with simple multi-exit merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node),
				//     node->name.c_str(), static_cast<const void *>(node->loop_merge_block),
				//     node->loop_merge_block->name.c_str());

				node->loop_merge_block = merge;
				const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			}
			else
			{
				if (!dominated_merge && node->pred_back_edge->succ.size() == 1)
				{
					// If continue block exits, and it still does not dominate, we should invent a ladder block
					// so we get one, otherwise splitting merge scopes will break.
					dominated_merge = create_ladder_block(node->pred_back_edge, node->pred_back_edge->succ.front(), ".merge");
				}

				// Single-escape merge.
				// It is unique, but we need workarounds later.
				//LOGI("Loop with ladder multi-exit merge: %p (%s) -> %p (%s)\n", static_cast<const void *>(node),
				//     node->name.c_str(), static_cast<const void *>(node->loop_merge_block),
				//     node->loop_merge_block->name.c_str());

				//if (dominated_merge)
				//{
					//LOGI("    Ladder block: %p (%s)\n", static_cast<const void *>(dominated_merge),
					//     dominated_merge->name.c_str());
				//}

				// We will use this block as a ladder.
				node->loop_ladder_block = dominated_merge;
				node->loop_merge_block = merge;

				const_cast<CFGNode *>(node->loop_merge_block)->add_unique_header(node);
			}
		}
	}

	return false;
}